

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

int Gia_ManCountPosWithNonZeroDrivers(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  
  lVar4 = (long)p->vCos->nSize;
  if (lVar4 < 1) {
    iVar3 = 0;
  }
  else {
    lVar5 = 0;
    iVar3 = 0;
    do {
      iVar1 = p->vCos->pArray[lVar5];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return iVar3;
      }
      uVar2 = *(uint *)(p->pObjs + iVar1);
      uVar6 = iVar1 - (uVar2 & 0x1fffffff);
      if ((int)uVar6 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      iVar3 = iVar3 + (uint)((uVar6 & 0x7fffffff) != 0 || (uVar2 >> 0x1d & 1) != 0);
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  return iVar3;
}

Assistant:

int Gia_ManCountPosWithNonZeroDrivers( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int i, Count = 0;
    Gia_ManForEachCo( p, pObj, i )
        Count += Gia_ObjFaninLit0(pObj, Gia_ObjId(p, pObj)) != 0;
    return Count;
}